

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSat.c
# Opt level: O1

void Cec2_ObjAddToFrontier(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Ptr_t *vFrontier,satoko_t *pSat)

{
  Gia_Obj_t *pGVar1;
  Vec_Int_t *p_00;
  int *piVar2;
  uint uVar3;
  int iVar4;
  void **ppvVar5;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Gia_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSat.c"
                  ,0x131,
                  "void Cec2_ObjAddToFrontier(Gia_Man_t *, Gia_Obj_t *, Vec_Ptr_t *, satoko_t *)");
  }
  if ((~*(ulong *)pObj & 0x1fffffff1fffffff) == 0) {
    __assert_fail("!Gia_ObjIsConst0(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSat.c"
                  ,0x132,
                  "void Cec2_ObjAddToFrontier(Gia_Man_t *, Gia_Obj_t *, Vec_Ptr_t *, satoko_t *)");
  }
  pGVar1 = p->pObjs;
  if ((pGVar1 <= pObj) && (pObj < pGVar1 + p->nObjs)) {
    uVar3 = (int)((long)pObj - (long)pGVar1 >> 2) * -0x55555555;
    if ((-1 < (int)uVar3) && ((int)uVar3 < (p->vCopies2).nSize)) {
      iVar4 = (p->vCopies2).pArray[uVar3 & 0x7fffffff];
      if (-1 < iVar4) {
        return;
      }
      if (iVar4 != -1) {
        __assert_fail("Cec2_ObjSatId(p, pObj) == -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSat.c"
                      ,0x135,
                      "void Cec2_ObjAddToFrontier(Gia_Man_t *, Gia_Obj_t *, Vec_Ptr_t *, satoko_t *)"
                     );
      }
      iVar4 = satoko_add_variable(pSat,'\0');
      p_00 = p->vVar2Obj;
      if (p_00 != (Vec_Int_t *)0x0) {
        if (p_00->nSize != iVar4) {
          __assert_fail("Vec_IntSize(p->vVar2Obj) == iVar",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSat.c"
                        ,0x139,
                        "void Cec2_ObjAddToFrontier(Gia_Man_t *, Gia_Obj_t *, Vec_Ptr_t *, satoko_t *)"
                       );
        }
        pGVar1 = p->pObjs;
        if ((pObj < pGVar1) || (pGVar1 + p->nObjs <= pObj)) goto LAB_006454b2;
        Vec_IntPush(p_00,(int)((ulong)((long)pObj - (long)pGVar1) >> 2) * -0x55555555);
      }
      pGVar1 = p->pObjs;
      if ((pObj < pGVar1) || (pGVar1 + p->nObjs <= pObj)) goto LAB_006454b2;
      uVar3 = (int)((long)pObj - (long)pGVar1 >> 2) * -0x55555555;
      if ((-1 < (int)uVar3) && ((int)uVar3 < (p->vCopies2).nSize)) {
        piVar2 = (p->vCopies2).pArray;
        if (piVar2[uVar3 & 0x7fffffff] != -1) {
          __assert_fail("Cec2_ObjSatId(p, pObj) == -1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSat.c"
                        ,0x4d,"int Cec2_ObjSetSatId(Gia_Man_t *, Gia_Obj_t *, int)");
        }
        piVar2[uVar3 & 0x7fffffff] = iVar4;
        if ((~*(uint *)pObj & 0x1fffffff) == 0 || (int)*(uint *)pObj < 0) {
          return;
        }
        uVar3 = vFrontier->nCap;
        if (vFrontier->nSize == uVar3) {
          if ((int)uVar3 < 0x10) {
            if (vFrontier->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc(0x80);
            }
            else {
              ppvVar5 = (void **)realloc(vFrontier->pArray,0x80);
            }
            vFrontier->pArray = ppvVar5;
            iVar4 = 0x10;
          }
          else {
            iVar4 = uVar3 * 2;
            if (iVar4 <= (int)uVar3) goto LAB_00645496;
            if (vFrontier->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc((ulong)uVar3 << 4);
            }
            else {
              ppvVar5 = (void **)realloc(vFrontier->pArray,(ulong)uVar3 << 4);
            }
            vFrontier->pArray = ppvVar5;
          }
          vFrontier->nCap = iVar4;
        }
LAB_00645496:
        iVar4 = vFrontier->nSize;
        vFrontier->nSize = iVar4 + 1;
        vFrontier->pArray[iVar4] = pObj;
        return;
      }
    }
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
LAB_006454b2:
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

void Cec2_ObjAddToFrontier( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Ptr_t * vFrontier, satoko_t * pSat )
{
    int iVar;
    assert( !Gia_IsComplement(pObj) );
    assert( !Gia_ObjIsConst0(pObj) );
    if ( Cec2_ObjSatId(p, pObj) >= 0 )
        return;
    assert( Cec2_ObjSatId(p, pObj) == -1 );
    iVar = satoko_add_variable(pSat, 0);
    if ( p->vVar2Obj )
    {
        assert( Vec_IntSize(p->vVar2Obj) == iVar );
        Vec_IntPush( p->vVar2Obj, Gia_ObjId(p, pObj) );
    }
    Cec2_ObjSetSatId( p, pObj, iVar );
    if ( Gia_ObjIsAnd(pObj) )
        Vec_PtrPush( vFrontier, pObj );
}